

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeStructRMW
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,AtomicRMWOp op,HeapType type,
          Index field,MemoryOrder order)

{
  StructRMW *pSVar1;
  bool bVar2;
  optional<wasm::HeapType> ht;
  Ok local_139;
  Err local_138;
  Err *local_118;
  Err *err_1;
  undefined1 local_108 [8];
  Result<wasm::Ok> _val_1;
  Err local_d8;
  Err *local_a8;
  Err *err;
  undefined1 local_98;
  undefined3 uStack_97;
  ChildPopper local_90;
  undefined1 local_88 [8];
  Result<wasm::Ok> _val;
  StructRMW curr;
  MemoryOrder order_local;
  Index field_local;
  AtomicRMWOp op_local;
  IRBuilder *this_local;
  HeapType type_local;
  
  pSVar1 = (StructRMW *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  this_local = (IRBuilder *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  StructRMW::StructRMW(pSVar1);
  ChildPopper::ChildPopper(&local_90,this);
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)&err,(HeapType *)&this_local);
  ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)err;
  ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_98;
  ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = uStack_97;
  ChildPopper::visitStructRMW((Result<wasm::Ok> *)local_88,&local_90,pSVar1,ht);
  local_a8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_88);
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_1_ = local_a8 != (Err *)0x0;
  if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_d8,local_a8);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_d8);
    wasm::Err::~Err(&local_d8);
  }
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _37_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_88);
  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
    err_1 = (Err *)this_local;
    anon_unknown_282::validateTypeAnnotation
              ((Result<wasm::Ok> *)local_108,(HeapType)this_local,(Expression *)curr._16_8_);
    local_118 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_108);
    bVar2 = local_118 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err(&local_138,local_118);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_138);
      wasm::Err::~Err(&local_138);
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar2;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_108);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
      pSVar1 = Builder::makeStructRMW
                         (&this->builder,op,field,(Expression *)curr._16_8_,curr.ref,order);
      push(this,(Expression *)pSVar1);
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_139);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeStructRMW(AtomicRMWOp op,
                                  HeapType type,
                                  Index field,
                                  MemoryOrder order) {
  StructRMW curr;
  curr.index = field;
  CHECK_ERR(ChildPopper{*this}.visitStructRMW(&curr, type));
  CHECK_ERR(validateTypeAnnotation(type, curr.ref));
  push(builder.makeStructRMW(op, field, curr.ref, curr.value, order));
  return Ok{};
}